

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

void __thiscall QInputDialog::setTextValue(QInputDialog *this,QString *text)

{
  QInputDialogPrivate *this_00;
  QWidget *pQVar1;
  QInputDialogPrivate *d;
  
  this_00 = *(QInputDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QInputDialogPrivate::chooseRightTextInputWidget(this_00);
  pQVar1 = this_00->inputWidget;
  if (pQVar1 == &this_00->lineEdit->super_QWidget) {
    QLineEdit::setText((QLineEdit *)&this_00->lineEdit->super_QWidget,text);
    return;
  }
  if (pQVar1 != (QWidget *)this_00->plainTextEdit) {
    if (pQVar1 != &this_00->comboBox->super_QWidget) {
      QInputDialogPrivate::setListViewText(this_00,text);
      return;
    }
    QInputDialogPrivate::setComboBoxText(this_00,text);
    return;
  }
  QPlainTextEdit::setPlainText(this_00->plainTextEdit,text);
  return;
}

Assistant:

void QInputDialog::setTextValue(const QString &text)
{
    Q_D(QInputDialog);

    setInputMode(TextInput);
    if (d->inputWidget == d->lineEdit) {
        d->lineEdit->setText(text);
    } else if (d->inputWidget == d->plainTextEdit) {
        d->plainTextEdit->setPlainText(text);
    } else if (d->inputWidget == d->comboBox) {
        d->setComboBoxText(text);
    } else {
        d->setListViewText(text);
    }
}